

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

QRgbaFloat32 *
qt_fetch_radial_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  bool bVar2;
  QRgbaFloat32 *pQVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  QRgbaFloat32 QVar16;
  
  dVar1 = (op->field_16).radial.a;
  uVar4 = -(ulong)(dVar1 < -dVar1);
  if (1e-12 < (double)(~uVar4 & (ulong)dVar1 | (ulong)-dVar1 & uVar4)) {
    dVar5 = (double)y + 0.5;
    dVar6 = (double)x + 0.5;
    dVar9 = data->m11;
    dVar15 = data->m12;
    dVar7 = data->m13;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      bVar2 = false;
    }
    else {
      bVar2 = data->m23 == 0.0;
    }
    dVar13 = dVar6 * dVar9 + dVar5 * data->m21 + data->dx;
    dVar14 = dVar6 * dVar15 + dVar5 * data->m22 + data->dy;
    dVar12 = 1.0 / (dVar1 + dVar1);
    if (!bVar2) {
      dVar1 = dVar7 * dVar6 + dVar5 * data->m23 + data->m33;
      for (pQVar3 = buffer; pQVar3 < buffer + length; pQVar3 = pQVar3 + 1) {
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar7 = dVar13 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x20);
          dVar9 = dVar14 * (1.0 / dVar1) - *(double *)((long)&data->field_23 + 0x28);
          dVar15 = (op->field_16).linear.dy * dVar9 +
                   (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) +
                   (op->field_16).linear.dx * dVar7;
          dVar15 = dVar15 + dVar15;
          dVar7 = dVar15 * dVar15 +
                  (op->field_16).radial.a * -4.0 *
                  ((op->field_16).linear.off - (dVar7 * dVar7 + dVar9 * dVar9));
          if (dVar7 < 0.0) {
            QVar16 = (QRgbaFloat32)ZEXT816(0);
          }
          else {
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            dVar9 = (-dVar15 - dVar7) * dVar12;
            dVar7 = (dVar7 - dVar15) * dVar12;
            if (dVar7 <= dVar9) {
              dVar7 = dVar9;
            }
            QVar16 = (QRgbaFloat32)ZEXT816(0);
            if (0.0 <= (op->field_16).linear.l * dVar7 + *(double *)((long)&data->field_23 + 0x30))
            {
              QVar16 = GradientBaseFP::fetchSingle(&(data->field_23).gradient,dVar7);
            }
          }
          *pQVar3 = QVar16;
        }
        else {
          pQVar3->r = 0.0;
          pQVar3->g = 0.0;
          pQVar3->b = 0.0;
          pQVar3->a = 0.0;
        }
        dVar13 = dVar13 + data->m11;
        dVar14 = dVar14 + data->m12;
        dVar1 = dVar1 + data->m13;
      }
      return buffer;
    }
    dVar13 = dVar13 - *(double *)((long)&data->field_23 + 0x20);
    dVar14 = dVar14 - *(double *)((long)&data->field_23 + 0x28);
    dVar7 = (op->field_16).linear.dx;
    dVar5 = (op->field_16).linear.dy;
    dVar10 = dVar14 * dVar5 +
             (op->field_16).linear.l * *(double *)((long)&data->field_23 + 0x30) + dVar13 * dVar7;
    dVar10 = dVar10 + dVar10;
    dVar1 = dVar1 * 4.0;
    dVar8 = dVar12 * dVar12;
    dVar6 = (dVar10 * dVar10 -
            ((op->field_16).linear.off - (dVar13 * dVar13 + dVar14 * dVar14)) * dVar1) * dVar8;
    if ((uint)ABS((float)dVar6) < 0x7f800000) {
      dVar5 = dVar7 * dVar9 + dVar5 * dVar15;
      dVar5 = dVar5 + dVar5;
      dVar11 = dVar9 * dVar9 + dVar15 * dVar15;
      dVar7 = dVar15 * dVar14 + dVar13 * dVar9;
      dVar7 = ((dVar7 + dVar7 + dVar11) * dVar1 + dVar5 * dVar5 + (dVar10 + dVar10) * dVar5) * dVar8
      ;
      if (((uint)ABS((float)dVar7) < 0x7f800000) &&
         (dVar8 = dVar8 * (dVar1 * (dVar11 + dVar11) + (dVar5 + dVar5) * dVar5),
         (uint)ABS((float)dVar8) < 0x7f800000)) {
        RadialFetchPlain<GradientBaseFP>::fetch
                  (buffer,buffer + length,op,data,dVar6,dVar7,dVar8,dVar10 * dVar12,dVar5 * dVar12);
        return buffer;
      }
    }
  }
  (*qt_memfill64)((quint64 *)buffer,0,(long)length);
  return buffer;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_radial_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_radial_gradient_template<RadialFetchPlain<GradientBaseFP>, QRgbaFloat32>(buffer, op, data, y, x, length);
}